

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS ref_collapse_to_remove_node1(REF_GRID ref_grid,REF_INT *actual_node0,REF_INT node1)

{
  REF_DBL *pRVar1;
  int *piVar2;
  REF_INT RVar3;
  REF_NODE ref_node;
  REF_INT *pRVar4;
  uint uVar5;
  REF_STATUS RVar6;
  REF_CAVITY_STATE RVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  REF_GRID_STRUCT *pRVar11;
  char *pcVar12;
  ulong uVar13;
  REF_BOOL allowed;
  REF_CAVITY ref_cavity;
  REF_INT nnode;
  REF_BOOL have_geometry_support;
  REF_BOOL allowed_cavity_ratio;
  REF_BOOL local;
  REF_DBL min_add;
  REF_DBL min_del;
  REF_INT node_to_collapse [1000];
  REF_INT order [1000];
  REF_DBL ratio_to_collapse [1000];
  int local_3efc;
  REF_INT *local_3ef8;
  REF_CAVITY local_3ef0;
  int local_3ee8;
  int local_3ee4;
  ulong local_3ee0;
  int local_3ed8;
  int local_3ed4;
  long local_3ed0;
  double local_3ec8;
  REF_GRID_STRUCT local_3ec0 [14];
  REF_INT local_2f18 [1000];
  REF_GRID_STRUCT local_1f78 [29];
  
  ref_node = ref_grid->node;
  local_3ef0 = (REF_CAVITY)0x0;
  *actual_node0 = -1;
  if (((node1 < 0) || (ref_node->max <= node1)) ||
     (uVar13 = (ulong)(uint)node1, ref_node->global[uVar13] < 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0xb4
           ,"ref_collapse_to_remove_node1","node1 is invalid");
    uVar5 = 1;
  }
  else {
    lVar8 = 0x28;
    if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
      lVar8 = 0x50;
    }
    uVar5 = ref_cell_node_list_around
                      (*(REF_CELL *)((long)ref_grid->cell + lVar8 + -0x10),node1,1000,&local_3ee8,
                       (REF_INT *)&local_3ec0[0].node);
    if (uVar5 == 0) {
      if (0 < local_3ee8) {
        pRVar11 = local_1f78;
        lVar8 = 0;
        local_3ef8 = actual_node0;
        local_3ee0 = uVar13;
        do {
          uVar5 = ref_node_ratio(ref_node,*(REF_INT *)((long)local_3ec0[0].cell + lVar8 * 4 + -8),
                                 node1,(REF_DBL *)pRVar11);
          if (uVar5 != 0) {
            pcVar12 = "ratio";
            uVar9 = 0xc2;
            goto LAB_0017cd53;
          }
          lVar8 = lVar8 + 1;
          pRVar11 = (REF_GRID_STRUCT *)&pRVar11->node;
          uVar13 = local_3ee0;
          actual_node0 = local_3ef8;
        } while (lVar8 < local_3ee8);
      }
      pRVar11 = local_1f78;
      uVar5 = ref_sort_heap_dbl(local_3ee8,(REF_DBL *)pRVar11,local_2f18);
      if (uVar5 == 0) {
        if (local_3ee8 < 1) {
          return 0;
        }
        lVar8 = 0;
        local_3ee0 = uVar13;
        do {
          RVar3 = *(REF_INT *)((long)local_3ec0[0].cell + (long)local_2f18[lVar8] * 4 + -8);
          ref_collapse_edge_mixed(ref_grid,(REF_INT)pRVar11,node1,&local_3efc);
          if (local_3efc != 0) {
            local_3ef8 = (REF_INT *)CONCAT44(local_3ef8._4_4_,RVar3);
            uVar5 = ref_collapse_edge_geometry(ref_grid,RVar3,node1,&local_3efc);
            if (uVar5 != 0) {
              pcVar12 = "col geom";
              uVar9 = 0xd8;
              goto LAB_0017cd53;
            }
            pRVar11 = (REF_GRID_STRUCT *)((ulong)local_3ef8 & 0xffffffff);
            if (local_3efc != 0) {
              uVar5 = ref_collapse_edge_manifold(ref_grid,(REF_INT)local_3ef8,node1,&local_3efc);
              if (uVar5 != 0) {
                pcVar12 = "col manifold";
                uVar9 = 0xdd;
                goto LAB_0017cd53;
              }
              pRVar11 = (REF_GRID_STRUCT *)((ulong)local_3ef8 & 0xffffffff);
              if (local_3efc != 0) {
                uVar5 = ref_collapse_edge_chord_height
                                  (ref_grid,(REF_INT)local_3ef8,node1,&local_3efc);
                if (uVar5 != 0) {
                  pcVar12 = "col edge chord height";
                  uVar9 = 0xe2;
                  goto LAB_0017cd53;
                }
                pRVar11 = (REF_GRID_STRUCT *)((ulong)local_3ef8 & 0xffffffff);
                if (local_3efc != 0) {
                  uVar5 = ref_collapse_edge_ratio(ref_grid,(REF_INT)local_3ef8,node1,&local_3efc);
                  if (uVar5 != 0) {
                    pcVar12 = "ratio";
                    uVar9 = 0xe6;
                    goto LAB_0017cd53;
                  }
                  RVar3 = (REF_INT)local_3ef8;
                  if (local_3efc != 0) {
                    uVar5 = ref_geom_supported(ref_grid->geom,(REF_INT)local_3ef8,&local_3ee4);
                    if (uVar5 != 0) {
                      pcVar12 = "geom";
                      uVar9 = 0xec;
                      goto LAB_0017cd53;
                    }
                    uVar5 = ref_collapse_edge_normdev(ref_grid,RVar3,node1,&local_3efc);
                    if (uVar5 != 0) {
                      pcVar12 = "normdev";
                      uVar9 = 0xed;
                      goto LAB_0017cd53;
                    }
                    pRVar11 = (REF_GRID_STRUCT *)((ulong)local_3ef8 & 0xffffffff);
                    if (local_3efc != 0) {
                      uVar5 = ref_collapse_edge_same_normal
                                        (ref_grid,(REF_INT)local_3ef8,node1,&local_3efc);
                      if (uVar5 != 0) {
                        pcVar12 = "normal deviation";
                        uVar9 = 0xf1;
                        goto LAB_0017cd53;
                      }
                      pRVar11 = (REF_GRID_STRUCT *)((ulong)local_3ef8 & 0xffffffff);
                      if (local_3efc != 0) {
                        if (local_3ee4 == 0) {
                          uVar5 = ref_collapse_edge_same_tangent
                                            (ref_grid,(REF_INT)local_3ef8,node1,&local_3efc);
                          if (uVar5 != 0) {
                            pcVar12 = "normal deviation";
                            uVar9 = 0xf6;
                            goto LAB_0017cd53;
                          }
                          pRVar11 = (REF_GRID_STRUCT *)((ulong)local_3ef8 & 0xffffffff);
                          if (local_3efc == 0) goto LAB_0017d083;
                          if ((local_3ee4 == 0) && (ref_grid->twod != 0)) {
                            uVar5 = ref_collapse_edge_twod_orientation
                                              (ref_grid,(REF_INT)local_3ef8,node1,&local_3efc);
                            if (uVar5 != 0) {
                              pcVar12 = "norm";
                              uVar9 = 0xfc;
                              goto LAB_0017cd53;
                            }
                            pRVar11 = (REF_GRID_STRUCT *)((ulong)local_3ef8 & 0xffffffff);
                            if (local_3efc == 0) goto LAB_0017d083;
                          }
                        }
                        uVar5 = ref_collapse_edge_tri_quality
                                          (ref_grid,(REF_INT)pRVar11,node1,&local_3efc);
                        pRVar4 = local_3ef8;
                        if (uVar5 != 0) {
                          pcVar12 = "tri qual";
                          uVar9 = 0x102;
                          goto LAB_0017cd53;
                        }
                        RVar3 = (REF_INT)local_3ef8;
                        if (local_3efc != 0) {
                          uVar5 = ref_collapse_edge_tet_quality
                                            (ref_grid,(REF_INT)local_3ef8,node1,&local_3efc);
                          if (uVar5 != 0) {
                            pcVar12 = "tet qual";
                            uVar9 = 0x107;
                            goto LAB_0017cd53;
                          }
                          pRVar11 = (REF_GRID_STRUCT *)((ulong)pRVar4 & 0xffffffff);
                          lVar10 = (long)RVar3;
                          ref_collapse_edge_local_cell(ref_grid,RVar3,node1,&local_3ed4);
                          if (local_3ed4 == 0) {
                            if (local_3efc != 0) {
                              pRVar4 = ref_node->age;
                              piVar2 = pRVar4 + lVar10;
                              *piVar2 = *piVar2 + 1;
                              piVar2 = pRVar4 + local_3ee0;
                              *piVar2 = *piVar2 + 1;
                            }
                          }
                          else {
                            local_3ed0 = lVar10;
                            if (local_3efc != 0) {
                              *actual_node0 = (REF_INT)local_3ef8;
                              uVar5 = ref_collapse_edge(ref_grid,(REF_INT)local_3ef8,node1);
                              if (uVar5 == 0) {
                                if (ref_grid->adapt->watch_topo == 0) {
                                  return 0;
                                }
                                uVar5 = ref_validation_cell_face_node(ref_grid,(REF_INT)local_3ef8);
                                if (uVar5 == 0) {
                                  return 0;
                                }
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                       ,0x13b,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                       "standard topo");
                                printf("node0 %d node1 %d\n",(ulong)local_3ef8 & 0xffffffff,
                                       (ulong)(uint)node1);
                                return uVar5;
                              }
                              pcVar12 = "col!";
                              uVar9 = 0x138;
                              goto LAB_0017cd53;
                            }
                            uVar5 = ref_cavity_create(&local_3ef0);
                            if (uVar5 != 0) {
                              pcVar12 = "cav create";
                              uVar9 = 0x114;
                              goto LAB_0017cd53;
                            }
                            pRVar11 = ref_grid;
                            RVar6 = ref_cavity_form_edge_collapse
                                              (local_3ef0,ref_grid,(REF_INT)local_3ef8,node1);
                            if ((RVar6 == 0) && (local_3ef0->state != REF_CAVITY_INCONSISTENT)) {
                              uVar5 = ref_cavity_enlarge_visible(local_3ef0);
                              if (uVar5 != 0) {
                                pcVar12 = "enlarge";
                                uVar9 = 0x118;
                                goto LAB_0017cd53;
                              }
                              RVar7 = local_3ef0->state;
                              if (RVar7 == REF_CAVITY_VISIBLE) {
                                uVar5 = ref_cavity_ratio(local_3ef0,&local_3ed8);
                                if (uVar5 != 0) {
                                  pcVar12 = "cavity ratio";
                                  uVar9 = 0x11b;
                                  goto LAB_0017cd53;
                                }
                                pRVar11 = local_3ec0;
                                uVar5 = ref_cavity_change(local_3ef0,(REF_DBL *)pRVar11,&local_3ec8)
                                ;
                                if (uVar5 != 0) {
                                  pcVar12 = "cavity change";
                                  uVar9 = 0x11d;
                                  goto LAB_0017cd53;
                                }
                                if ((local_3ed8 != 0) &&
                                   (pRVar1 = &ref_grid->adapt->collapse_quality_absolute,
                                   *pRVar1 <= local_3ec8 && local_3ec8 != *pRVar1)) {
                                  *actual_node0 = (REF_INT)local_3ef8;
                                  uVar5 = ref_cavity_replace(local_3ef0);
                                  if (uVar5 == 0) {
                                    uVar5 = ref_cavity_free(local_3ef0);
                                    if (uVar5 == 0) {
                                      local_3ef0 = (REF_CAVITY)0x0;
                                      if (ref_grid->adapt->watch_topo == 0) {
                                        return 0;
                                      }
                                      uVar5 = ref_validation_cell_face_node
                                                        (ref_grid,(REF_INT)local_3ef8);
                                      if (uVar5 == 0) {
                                        return 0;
                                      }
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                             ,0x128,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                             "cavity topo");
                                      return uVar5;
                                    }
                                    pcVar12 = "cav free";
                                    uVar9 = 0x124;
                                  }
                                  else {
                                    pcVar12 = "cav replace";
                                    uVar9 = 0x123;
                                  }
                                  goto LAB_0017cd53;
                                }
                                RVar7 = local_3ef0->state;
                              }
                              if (RVar7 == REF_CAVITY_PARTITION_CONSTRAINED) {
                                pRVar4 = ref_node->age;
                                piVar2 = pRVar4 + local_3ed0;
                                *piVar2 = *piVar2 + 1;
                                piVar2 = pRVar4 + local_3ee0;
                                *piVar2 = *piVar2 + 1;
                              }
                            }
                            uVar5 = ref_cavity_free(local_3ef0);
                            if (uVar5 != 0) {
                              pcVar12 = "cav free";
                              uVar9 = 0x131;
                              goto LAB_0017cd53;
                            }
                            local_3ef0 = (REF_CAVITY)0x0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_0017d083:
          lVar8 = lVar8 + 1;
          if (local_3ee8 <= lVar8) {
            return 0;
          }
        } while( true );
      }
      pcVar12 = "sort lengths";
      uVar9 = 0xc5;
    }
    else {
      pcVar12 = "da hood";
      uVar9 = 0xbe;
    }
LAB_0017cd53:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uVar9,"ref_collapse_to_remove_node1",(ulong)uVar5,pcVar12);
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_to_remove_node1(REF_GRID ref_grid,
                                                REF_INT *actual_node0,
                                                REF_INT node1) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT nnode, node;
  REF_INT node_to_collapse[MAX_NODE_LIST];
  REF_INT order[MAX_NODE_LIST];
  REF_DBL ratio_to_collapse[MAX_NODE_LIST];
  REF_INT node0;
  REF_BOOL allowed, local, have_geometry_support;
  REF_CAVITY ref_cavity = (REF_CAVITY)NULL;
  REF_BOOL valid_cavity;
  REF_BOOL allowed_cavity_ratio;
  REF_DBL min_del, min_add;
  REF_BOOL audit = REF_FALSE;

  *actual_node0 = REF_EMPTY;
  RAS(ref_node_valid(ref_node, node1), "node1 is invalid");

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  RSS(ref_cell_node_list_around(ref_cell, node1, MAX_NODE_LIST, &nnode,
                                node_to_collapse),
      "da hood");
  for (node = 0; node < nnode; node++) {
    RSS(ref_node_ratio(ref_node, node_to_collapse[node], node1,
                       &(ratio_to_collapse[node])),
        "ratio");
  }

  RSS(ref_sort_heap_dbl(nnode, ratio_to_collapse, order), "sort lengths");

  /* audit = (nnode > 0 && ratio_to_collapse[order[0]] < 0.2); */
  if (audit) {
    printf("node1 %d %f %f %f\n", node1, ref_node_xyz(ref_node, 0, node1),
           ref_node_xyz(ref_node, 1, node1), ref_node_xyz(ref_node, 2, node1));
  }

  for (node = 0; node < nnode; node++) {
    node0 = node_to_collapse[order[node]];
    if (audit)
      printf(" %d node0 %d ratio %f\n", nnode - node, node0,
             ratio_to_collapse[order[node]]);

    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    if (!allowed && audit) printf("   mixed\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    if (!allowed && audit) printf("   geom\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_manifold(ref_grid, node0, node1, &allowed),
        "col manifold");
    if (!allowed && audit) printf("   manifold\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_chord_height(ref_grid, node0, node1, &allowed),
        "col edge chord height");
    if (!allowed && audit) printf("   chord\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_ratio(ref_grid, node0, node1, &allowed), "ratio");
    if (!allowed && audit) printf("   ratio\n");
    if (!allowed) continue;

    RSS(ref_geom_supported(ref_grid_geom(ref_grid), node0,
                           &have_geometry_support),
        "geom");
    RSS(ref_collapse_edge_normdev(ref_grid, node0, node1, &allowed), "normdev");
    if (!allowed && audit) printf("   normdev\n");
    if (!allowed) continue;
    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "normal deviation");
    if (!allowed && audit) printf("   same normal\n");
    if (!allowed) continue;
    if (!have_geometry_support) {
      RSS(ref_collapse_edge_same_tangent(ref_grid, node0, node1, &allowed),
          "normal deviation");
      if (!allowed && audit) printf("   same tangent\n");
      if (!allowed) continue;
    }
    if (!have_geometry_support && ref_grid_twod(ref_grid)) {
      RSS(ref_collapse_edge_twod_orientation(ref_grid, node0, node1, &allowed),
          "norm");
      if (!allowed && audit) printf("   twod orientation\n");
      if (!allowed) continue;
    }

    RSS(ref_collapse_edge_tri_quality(ref_grid, node0, node1, &allowed),
        "tri qual");
    if (!allowed && audit) printf("   tri qual\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_tet_quality(ref_grid, node0, node1, &allowed),
        "tet qual");
    if (!allowed && audit) printf("   tet qual\n");

    RSS(ref_collapse_edge_local_cell(ref_grid, node0, node1, &local), "colloc");
    if (!local) {
      if (allowed) {
        ref_node_age(ref_node, node0)++;
        ref_node_age(ref_node, node1)++;
      }
      continue;
    }

    if (!allowed) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      if ((REF_SUCCESS ==
           ref_cavity_form_edge_collapse(ref_cavity, ref_grid, node0, node1)) &&
          (REF_CAVITY_INCONSISTENT != ref_cavity_state(ref_cavity))) {
        RSS(ref_cavity_enlarge_visible(ref_cavity), "enlarge");
        if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
          RSS(ref_cavity_ratio(ref_cavity, &allowed_cavity_ratio),
              "cavity ratio");
          RSS(ref_cavity_change(ref_cavity, &min_del, &min_add),
              "cavity change");
          valid_cavity =
              allowed_cavity_ratio &&
              (min_add > ref_grid_adapt(ref_grid, collapse_quality_absolute));
          if (valid_cavity) {
            *actual_node0 = node0;
            RSS(ref_cavity_replace(ref_cavity), "cav replace");
            RSS(ref_cavity_free(ref_cavity), "cav free");
            ref_cavity = (REF_CAVITY)NULL;
            if (ref_grid_adapt(ref_grid, watch_topo))
              RSS(ref_validation_cell_face_node(ref_grid, node0),
                  "cavity topo");
            return REF_SUCCESS;
          }
        }
        if (REF_CAVITY_PARTITION_CONSTRAINED == ref_cavity_state(ref_cavity)) {
          ref_node_age(ref_node, node0)++;
          ref_node_age(ref_node, node1)++;
        }
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
      ref_cavity = (REF_CAVITY)NULL;
      if (!allowed && audit) printf("   cav unsuccessful\n");
      continue;
    }

    *actual_node0 = node0;
    RSS(ref_collapse_edge(ref_grid, node0, node1), "col!");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSB(ref_validation_cell_face_node(ref_grid, node0), "standard topo",
          { printf("node0 %d node1 %d\n", node0, node1); });
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}